

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

void NoopOAATReadHash(void *key,int len,uint32_t seed,void *out)

{
  ulong uVar1;
  uint32_t h;
  uint8_t *data;
  
  if (0 < len) {
    uVar1 = (ulong)(uint)len + (long)key;
    if ((ulong)(uint)len + (long)key <= (long)key + 1U) {
      uVar1 = (long)key + 1U;
    }
    seed = (uint32_t)*(byte *)((long)key + ~(ulong)key + uVar1);
  }
  *(uint32_t *)out = seed;
  return;
}

Assistant:

void
NoopOAATReadHash(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t	 h = seed;
  const uint8_t *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];

  while (data < end) {
    h = *data++;
  }
  *(uint32_t *) out = h;
}